

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)

{
  ImGuiWindow **ppIVar1;
  ImGuiContext *g;
  ImGuiWindow *pIVar2;
  ImGuiWindow *pIVar3;
  
  if ((flags & 0x40U) != 0) {
    __assert_fail("(flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1b5b,"bool ImGui::IsWindowHovered(ImGuiHoveredFlags)");
  }
  if ((flags & 4U) != 0) {
    pIVar2 = GImGui->HoveredWindow;
    if (pIVar2 == (ImGuiWindow *)0x0) {
      return false;
    }
    goto LAB_001336a1;
  }
  pIVar2 = GImGui->HoveredWindow;
  switch(flags & 3) {
  case 0:
    pIVar3 = GImGui->CurrentWindow;
    break;
  case 1:
    if (pIVar2 == (ImGuiWindow *)0x0) {
      return false;
    }
    pIVar3 = pIVar2;
    if (pIVar2->RootWindow != GImGui->CurrentWindow) {
      while (pIVar3 != GImGui->CurrentWindow) {
        ppIVar1 = &pIVar3->ParentWindow;
        pIVar3 = *ppIVar1;
        if (*ppIVar1 == (ImGuiWindow *)0x0) {
          return false;
        }
      }
    }
    goto LAB_001336a1;
  case 2:
    pIVar3 = GImGui->CurrentWindow->RootWindowDockStop;
    break;
  case 3:
    if (pIVar2 == (ImGuiWindow *)0x0) {
      return false;
    }
    if (pIVar2->RootWindowDockStop != GImGui->CurrentWindow->RootWindowDockStop) {
      return false;
    }
    goto LAB_001336a1;
  }
  if (pIVar2 != pIVar3) {
    return false;
  }
LAB_001336a1:
  if (((((((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
          (pIVar3 = GImGui->NavWindow->RootWindow, pIVar3 == (ImGuiWindow *)0x0)) ||
         (pIVar3->WasActive != true)) || (pIVar3 == pIVar2->RootWindow)) ||
       ((((uint)pIVar3->Flags >> 0x1b & 1) == 0 &&
        (((flags & 8U) != 0 || ((pIVar3->Flags & 0x4000000U) == 0)))))) &&
      ((pIVar2->Viewport == GImGui->MouseViewport ||
       ((GImGui->MovingWindow != (ImGuiWindow *)0x0 &&
        (pIVar2->RootWindow == GImGui->MovingWindow->RootWindow)))))) &&
     (((flags & 0x20U) != 0 ||
      (((GImGui->ActiveId == 0 || (GImGui->ActiveIdAllowOverlap != false)) ||
       (GImGui->ActiveId == pIVar2->MoveId)))))) {
    return true;
  }
  return false;
}

Assistant:

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)
{
    IM_ASSERT((flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0);   // Flags not supported by this function
    ImGuiContext& g = *GImGui;

    if (flags & ImGuiHoveredFlags_AnyWindow)
    {
        if (g.HoveredWindow == NULL)
            return false;
    }
    else
    {
        switch (flags & (ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows))
        {
        case ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows:
            if (g.HoveredWindow == NULL || g.HoveredWindow->RootWindowDockStop != g.CurrentWindow->RootWindowDockStop)
                return false;
            break;
        case ImGuiHoveredFlags_RootWindow:
            if (g.HoveredWindow != g.CurrentWindow->RootWindowDockStop)
                return false;
            break;
        case ImGuiHoveredFlags_ChildWindows:
            if (g.HoveredWindow == NULL || !IsWindowChildOf(g.HoveredWindow, g.CurrentWindow))
                return false;
            break;
        default:
            if (g.HoveredWindow != g.CurrentWindow)
                return false;
            break;
        }
    }

    if (!IsWindowContentHoverable(g.HoveredWindow, flags))
        return false;
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && !g.ActiveIdAllowOverlap && g.ActiveId != g.HoveredWindow->MoveId)
            return false;
    return true;
}